

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::makepoint(tetgenmesh *this,point *pnewpoint,verttype vtype)

{
  int iVar1;
  point pdVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  pdVar2 = (point)memorypool::alloc(this->points);
  *pnewpoint = pdVar2;
  uVar5 = 0;
  uVar3 = (ulong)(uint)this->numpointattrib;
  if (this->numpointattrib < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2[uVar5 + 3] = 0.0;
  }
  iVar1 = this->pointmtrindex;
  uVar5 = 0;
  uVar3 = (ulong)(uint)this->sizeoftensor;
  if (this->sizeoftensor < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2[(long)iVar1 + uVar5] = 0.0;
  }
  lVar4 = (long)this->point2simindex;
  pdVar2[lVar4] = 0.0;
  (*pnewpoint)[lVar4 + 1] = 0.0;
  if ((((this->b->plc != 0) || (this->b->refine != 0)) &&
      ((*pnewpoint)[lVar4 + 2] = 0.0, this->b->metric != 0)) && (this->bgm != (tetgenmesh *)0x0)) {
    (*pnewpoint)[lVar4 + 3] = 0.0;
  }
  pdVar2 = *pnewpoint;
  *(uint *)((long)pdVar2 + (long)this->pointmarkindex * 4) =
       (int)this->points->items - (uint)(this->in->firstnumber == 0);
  *(undefined4 *)((long)pdVar2 + (long)this->pointmarkindex * 4 + 4) = 0;
  *(verttype *)((long)pdVar2 + (long)this->pointmarkindex * 4 + 4) =
       (uint)*(byte *)((long)pdVar2 + (long)this->pointmarkindex * 4 + 4) | vtype << 8;
  return;
}

Assistant:

void tetgenmesh::makepoint(point* pnewpoint, enum verttype vtype)
{
  int i;

  *pnewpoint = (point) points->alloc();

  // Initialize the point attributes.
  for (i = 0; i < numpointattrib; i++) {
    (*pnewpoint)[3 + i] = 0.0;
  }
  // Initialize the metric tensor.
  for (i = 0; i < sizeoftensor; i++) {
    (*pnewpoint)[pointmtrindex + i] = 0.0;
  }
  setpoint2tet(*pnewpoint, NULL);
  setpoint2ppt(*pnewpoint, NULL);
  if (b->plc || b->refine) {
    // Initialize the point-to-simplex field.
    setpoint2sh(*pnewpoint, NULL);
    if (b->metric && (bgm != NULL)) {
      setpoint2bgmtet(*pnewpoint, NULL);
    }
  }
  // Initialize the point marker (starting from in->firstnumber).
  setpointmark(*pnewpoint, (int) (points->items) - (!in->firstnumber));
  // Clear all flags.
  ((int *) (*pnewpoint))[pointmarkindex + 1] = 0;
  // Initialize (set) the point type. 
  setpointtype(*pnewpoint, vtype);
}